

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddMouseWheelEvent(ImGuiIO *this,float wheel_x,float wheel_y)

{
  float in_XMM0_Da;
  float in_XMM1_Da;
  ImGuiInputEvent e;
  ImGuiContext *g;
  ImGuiInputEvent *in_stack_ffffffffffffffc8;
  
  if ((((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) || (in_XMM1_Da != 0.0)) || (NAN(in_XMM1_Da))) {
    ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x1102ed);
    ImVector<ImGuiInputEvent>::push_back
              ((ImVector<ImGuiInputEvent> *)0x100000002,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void ImGuiIO::AddMouseWheelEvent(float wheel_x, float wheel_y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (wheel_x == 0.0f && wheel_y == 0.0f)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseWheel;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseWheel.WheelX = wheel_x;
    e.MouseWheel.WheelY = wheel_y;
    g.InputEventsQueue.push_back(e);
}